

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerIdPointsToSet.h
# Opt level: O2

bool __thiscall
dg::pta::PointerIdPointsToSet::pointsToTarget(PointerIdPointsToSet *this,PSNode *target)

{
  bool bVar1;
  const_iterator __begin2;
  const_iterator local_30;
  
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::begin(&local_30,&this->pointers);
  while( true ) {
    bVar1 = local_30.pos != 0 ||
            local_30.container_it.
            super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
            != (__node_type *)0x0;
    if (local_30.pos == 0 &&
        local_30.container_it.
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur ==
        (__node_type *)0x0) {
      return bVar1;
    }
    if (*(PSNode **)
         (*(long *)&(((_Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false> *)
                     ((long)local_30.container_it.
                            super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                            ._M_cur + 8))->
                    super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>).
                    _M_storage._M_storage * 0x10 + -0x10 + local_30.pos * 0x10 + _getConstant) ==
        target) break;
    ADT::
    SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
    ::const_iterator::operator++(&local_30);
  }
  return bVar1;
}

Assistant:

bool pointsToTarget(PSNode *target) const {
        for (auto ptrid : pointers) {
            const auto &ptr = getPointer(ptrid);
            if (ptr.target == target) {
                return true;
            }
        }
        return false;
    }